

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> * __thiscall
EOPlus::Parser::ParseScopes
          (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *__return_storage_ptr__,Parser *this
          )

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  Parser_Error *this_00;
  pointer pPVar4;
  Token *t_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  *local_398;
  Token local_368;
  string local_318;
  allocator<char> local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  anon_class_1_0_00000001 local_289;
  function<bool_(const_EOPlus::Token_&)> local_288;
  undefined1 local_268 [8];
  Scope s;
  Token local_208;
  _Self local_1b8;
  string local_1b0;
  _Self local_190;
  const_iterator it;
  undefined1 local_148 [8];
  Token t;
  Type local_f0 [7];
  Type local_d4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  *local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  Parser *this_local;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *scopes;
  
  local_18 = (undefined1  [8])this;
  this_local = (Parser *)__return_storage_ptr__;
  if ((ParseScopes()::scope_id_map_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ParseScopes()::scope_id_map_abi_cxx11_), iVar2 != 0)) {
    local_d0 = &local_c8;
    local_d4 = Character;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[10],_EOPlus::Scope::Type,_true>
              (local_d0,(char (*) [10])"character",&local_d4);
    local_d0 = &local_a0;
    local_f0[2] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[4],_EOPlus::Scope::Type,_true>
              (local_d0,(char (*) [4])0x24e41d,local_f0 + 2);
    local_d0 = &local_78;
    local_f0[1] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[4],_EOPlus::Scope::Type,_true>
              (local_d0,(char (*) [4])0x24e995,local_f0 + 1);
    local_d0 = &local_50;
    local_f0[0] = World;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
    ::pair<const_char_(&)[6],_EOPlus::Scope::Type,_true>(local_d0,(char (*) [6])0x252f1b,local_f0);
    local_28 = &local_c8;
    local_20 = 4;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
                 *)&t.field_0x4e);
    __l._M_len = local_20;
    __l._M_array = local_28;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
    ::map(&ParseScopes()::scope_id_map_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &t.field_0x4f,(allocator_type *)&t.field_0x4e);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
                  *)&t.field_0x4e);
    local_398 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
                 *)&local_28;
    do {
      local_398 = local_398 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>
      ::~pair(local_398);
    } while (local_398 != &local_c8);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
                 ::~map,&ParseScopes()::scope_id_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ParseScopes()::scope_id_map_abi_cxx11_);
  }
  t._77_1_ = 0;
  std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::deque(__return_storage_ptr__);
  util::variant::variant((variant *)&it);
  Token::Token((Token *)local_148,Invalid,(variant *)&it);
  util::variant::~variant((variant *)&it);
  do {
    bVar1 = GetToken(this,(Token *)local_148,1);
    if (!bVar1) {
LAB_00179106:
      t._77_1_ = 1;
      s.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._4_4_ = 1;
      Token::~Token((Token *)local_148);
      if ((t._77_1_ & 1) == 0) {
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    util::variant::operator_cast_to_string(&local_1b0,(variant *)&t);
    local_190._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
         ::find(&ParseScopes()::scope_id_map_abi_cxx11_,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    local_1b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>_>
         ::end(&ParseScopes()::scope_id_map_abi_cxx11_);
    bVar1 = std::operator==(&local_190,&local_1b8);
    if (bVar1) {
      pPVar4 = std::
               unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ::operator->(&this->tok);
      Token::Token(&local_208,(Token *)local_148);
      Parser_Token_Server_Base::PutBack(pPVar4,&local_208);
      Token::~Token(&local_208);
      goto LAB_00179106;
    }
    Scope::Scope((Scope *)local_268);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::Scope::Type>_>
             ::operator->(&local_190);
    local_268._0_4_ = ppVar3->second;
    std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::push_back
              (__return_storage_ptr__,(value_type *)local_268);
    std::function<bool(EOPlus::Token_const&)>::function<EOPlus::Parser::ParseScopes()::__0,void>
              ((function<bool(EOPlus::Token_const&)> *)&local_288,&local_289);
    bVar1 = GetTokenIf(this,(Token *)local_148,&local_288,0x40);
    std::function<bool_(const_EOPlus::Token_&)>::~function(&local_288);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = (Parser_Error *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"Expected \'.\' after scope-identifier.",&local_2f1);
      std::operator+(&local_2d0,&local_2f0," Got: ");
      pPVar4 = std::
               unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ::operator->(&this->tok);
      Parser_Token_Server_Base::RejectToken(&local_368,pPVar4);
      token_got_string_abi_cxx11_(&local_318,(EOPlus *)&local_368,t_00);
      std::operator+(&local_2b0,&local_2d0,&local_318);
      pPVar4 = std::
               unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ::operator->(&this->tok);
      iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
      Parser_Error::Parser_Error(this_00,&local_2b0,iVar2);
      __cxa_throw(this_00,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
    }
    Scope::~Scope((Scope *)local_268);
  } while( true );
}

Assistant:

std::deque<Scope> Parser::ParseScopes()
	{
		static const std::map<std::string, Scope::Type> scope_id_map{
			{"character", Scope::Character},
			{"npc", Scope::NPC},
			{"map", Scope::Map},
			{"world", Scope::World}
		};

		std::deque<Scope> scopes;
		Token t;

		while (this->GetToken(t, Token::Identifier))
		{
			auto it = scope_id_map.find(std::string(t.data));

			if (it == scope_id_map.end())
			{
				this->tok->PutBack(t);
				return scopes;
			}

			Scope s;
			s.type = it->second;

			scopes.push_back(s);

			if (!this->GetTokenIf(t, [](const Token& t) { return std::string(t.data) == "."; }, Token::Symbol))
				PARSER_ERROR_GOT("Expected '.' after scope-identifier.");
		}

		return scopes;
	}